

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::MicroString::SetImpl
          (MicroString *this,string_view data,Arena *arena,size_t inline_capacity)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  LargeRepKind LVar4;
  StringRep *this_00;
  ulong uVar5;
  size_type sVar6;
  char *pcVar7;
  const_pointer pvVar8;
  MicroRep *pMVar9;
  LargeRep *pLVar10;
  LargeRep *h;
  MicroRep *h_4;
  StringRep *h_3;
  LargeRep *h_2;
  MicroRep *h_1;
  size_t inline_capacity_local;
  Arena *arena_local;
  MicroString *this_local;
  string_view data_local;
  
  data_local._M_len = (size_t)data._M_str;
  this_local = (MicroString *)data._M_len;
  bVar3 = is_micro_rep(this);
  if (bVar3) {
    pMVar9 = micro_rep(this);
    bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    if (bVar3) {
      MicroRep::ChangeSize(pMVar9,'\0');
      return;
    }
    bVar1 = pMVar9->capacity;
    sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    if (sVar6 <= bVar1) {
      MicroRep::Unpoison(pMVar9);
      pcVar7 = MicroRep::data(pMVar9);
      pvVar8 = std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      memmove(pcVar7,pvVar8,sVar6);
      sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      MicroRep::ChangeSize(pMVar9,(uint8_t)sVar6);
      return;
    }
    if (arena == (Arena *)0x0) {
      DestroySlow(this);
    }
  }
  else {
    bVar3 = is_large_rep(this);
    if (bVar3) {
      LVar4 = large_rep_kind(this);
      if (kUnowned < LVar4) {
        if (LVar4 == kString) {
          this_00 = string_rep(this);
          uVar5 = std::__cxx11::string::capacity();
          sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size
                            ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
          if (sVar6 <= uVar5) {
            pvVar8 = std::basic_string_view<char,_std::char_traits<char>_>::data
                               ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
            std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
            std::__cxx11::string::assign((char *)&this_00->str,(ulong)pvVar8);
            StringRep::ResetBase(this_00);
            return;
          }
        }
        else if (LVar4 == kOwned) {
          pLVar10 = large_rep(this);
          bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                            ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
          if (bVar3) {
            LargeRep::ChangeSize(pLVar10,0);
            return;
          }
          uVar2 = pLVar10->capacity;
          sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size
                            ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
          if (sVar6 <= uVar2) {
            LargeRep::Unpoison(pLVar10);
            pcVar7 = pLVar10->payload;
            pvVar8 = std::basic_string_view<char,_std::char_traits<char>_>::data
                               ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
            sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size
                              ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
            memmove(pcVar7,pvVar8,sVar6);
            sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size
                              ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
            LargeRep::ChangeSize(pLVar10,sVar6);
            return;
          }
        }
      }
      if (arena == (Arena *)0x0) {
        DestroySlow(this);
      }
    }
  }
  sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (inline_capacity < sVar6) {
    sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    if (sVar6 < 0x100) {
      sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      pMVar9 = AllocateMicroRep(this,sVar6,arena);
      pcVar7 = MicroRep::data(pMVar9);
      pvVar8 = std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      memcpy(pcVar7,pvVar8,sVar6);
    }
    else {
      sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      pLVar10 = AllocateOwnedRep(this,sVar6,arena);
      pcVar7 = pLVar10->payload;
      pvVar8 = std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      memcpy(pcVar7,pvVar8,sVar6);
    }
  }
  else {
    sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    set_inline_size(this,sVar6);
    bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    if (!bVar3) {
      pcVar7 = inline_head(this);
      pvVar8 = std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      memmove(pcVar7,pvVar8,sVar6);
    }
  }
  return;
}

Assistant:

void MicroString::SetImpl(absl::string_view data, Arena* arena,
                          size_t inline_capacity) {
  // Reuse space if possible.
  if (is_micro_rep()) {
    auto* h = micro_rep();
    if (data.empty()) {
      h->ChangeSize(0);
      return;
    } else if (h->capacity >= data.size()) {
      // We unpoison the buffer first, memmove, then repoison to the new size.
      // We can't poison to the new size first because the input data might be
      // aliasing the previously allowed part of `this`.
      h->Unpoison();
      memmove(h->data(), data.data(), data.size());
      h->ChangeSize(data.size());
      return;
    }
    if (arena == nullptr) {
      DestroySlow();
    }
  } else if (is_large_rep()) {
    switch (large_rep_kind()) {
      case kOwned: {
        auto* h = large_rep();
        if (data.empty()) {
          h->ChangeSize(0);
          return;
        } else if (h->capacity >= data.size()) {
          h->Unpoison();
          memmove(h->payload, data.data(), data.size());
          h->ChangeSize(data.size());
          return;
        }
        break;
      }
      case kString: {
        auto* h = string_rep();
        if (h->str.capacity() >= data.size()) {
          h->str.assign(data.data(), data.size());
          h->ResetBase();
          return;
        }
        break;
      }
      case kAlias:
      case kUnowned:
        // No capacity to reuse.
        break;
    }
    if (arena == nullptr) {
      DestroySlow();
    }
  }

  // If we fit in the inline space, use it.
  if (data.size() <= inline_capacity) {
    set_inline_size(data.size());
    if (!data.empty()) {
      memmove(inline_head(), data.data(), data.size());
    }
    return;
  }

  // Try MicroString rep first.
  if (data.size() <= kMaxMicroRepCapacity) {
    MicroRep* h = AllocateMicroRep(data.size(), arena);
    memcpy(h->data(), data.data(), data.size());
    return;
  }

  // Input is too big for MicroString, use the large large_rep representation.
  LargeRep* h = AllocateOwnedRep(data.size(), arena);
  memcpy(h->payload, data.data(), data.size());
}